

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLib.c
# Opt level: O3

JL_STATUS JlJsonToStructEx(char *JsonString,JlMarshallElement *StructDescription,
                          size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,
                          _Bool AllowJson5,void *Structure,size_t *pErrorAtPos)

{
  JL_STATUS JVar1;
  JlDataObject *objectTree;
  JlDataObject *local_38;
  
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if ((Structure != (void *)0x0 && StructDescriptionCount != 0) &&
      (StructDescription != (JlMarshallElement *)0x0 && JsonString != (char *)0x0)) {
    local_38 = (JlDataObject *)0x0;
    JVar1 = JlParseJsonEx(JsonString,AllowJson5,&local_38,pErrorAtPos);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlUnmarshallToStructEx
                        (local_38,StructDescription,StructDescriptionCount,
                         IgnoreExistingValuesInStruct,Structure,pErrorAtPos);
      JlFreeObjectTree(&local_38);
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlJsonToStructEx
    (
        char const*                 JsonString,                     // [in]
        JlMarshallElement const*    StructDescription,              // [in]
        size_t                      StructDescriptionCount,         // [in]
        bool                        IgnoreExistingValuesInStruct,   // [in]
        bool                        AllowJson5,                     // [in]
        void*                       Structure,                      // [in,out]
        size_t*                     pErrorAtPos                     // [out] [OPTIONAL]
    )
{
    JL_STATUS jlStatus;

    if(     NULL != JsonString
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        JlDataObject* objectTree = NULL;

        jlStatus = JlParseJsonEx( JsonString, AllowJson5, &objectTree, pErrorAtPos );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlUnmarshallToStructEx(
                objectTree,
                StructDescription, StructDescriptionCount,
                IgnoreExistingValuesInStruct,
                Structure,
                pErrorAtPos );

            // Now free the intermediate objectTree regardless of whether the unmarshall succeeded.
            (void) JlFreeObjectTree( &objectTree );
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}